

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmd.c
# Opt level: O0

boolean minimal_enlightenment(void)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  schar sVar4;
  schar sVar5;
  schar sVar6;
  schar sVar7;
  schar sVar8;
  int iVar9;
  nh_menuitem *pnVar10;
  char *pcVar11;
  char *pcVar12;
  long lVar13;
  char *local_3c8;
  char *local_3c0;
  char *local_3a8;
  char *local_3a0;
  char *local_388;
  char *local_380;
  char *local_368;
  int local_2fc;
  char *local_2f8;
  nh_menuitem *_item__22;
  nh_menuitem *_item__21;
  nh_menuitem *_item__20;
  nh_menuitem *_item__19;
  nh_menuitem *_item__18;
  nh_menuitem *_item__17;
  nh_menuitem *_item__16;
  nh_menuitem *_item__15;
  nh_menuitem *_item__14;
  nh_menuitem *_item__13;
  nh_menuitem *_item__12;
  nh_menuitem *_item__11;
  nh_menuitem *_item__10;
  nh_menuitem *_item__9;
  nh_menuitem *_item__8;
  nh_menuitem *_item__7;
  nh_menuitem *_item__6;
  nh_menuitem *_item__5;
  nh_menuitem *_item__4;
  nh_menuitem *_item__3;
  nh_menuitem *_item__2;
  nh_menuitem *_item__1;
  nh_menuitem *_item_;
  menulist menu;
  char buf2 [256];
  char buf [256];
  int selected [1];
  int n;
  int genidx;
  
  init_menulist((menulist *)&_item_);
  menu.size._0_1_ = 0;
  buf2[0xf8] = '\0';
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_HEADING;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"Character Information");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  sprintf(buf2 + 0xf8,"%-10s: %-12s","name",plname);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if (u.umonnum == u.umonster) {
    sprintf(buf2 + 0xf8,"%-10s: %-12s","race",urace.noun);
  }
  else {
    pcVar11 = mons_mname(youmonst.data);
    sprintf(buf2 + 0xf8,"%-10s: %-12s (started %s)","race",pcVar11,urace.noun);
  }
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  bVar1 = flags.female;
  if (u.umonnum != u.umonster) {
    bVar1 = (byte)u._1052_1_ >> 3 & 1;
  }
  if ((bVar1 == 0) || (urole.name.f == (char *)0x0)) {
    local_2f8 = urole.name.m;
  }
  else {
    local_2f8 = urole.name.f;
  }
  sprintf(buf2 + 0xf8,"%-10s: %-12s","role",local_2f8);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if (((youmonst.data)->mflags2 & 0x40000) == 0) {
    local_2fc = (int)flags.female;
  }
  else {
    local_2fc = 2;
  }
  if (local_2fc == u.initgend) {
    sprintf(buf2 + 0xf8,"%-10s: %-12s","gender",genders[local_2fc].adj);
  }
  else {
    sprintf(buf2 + 0xf8,"%-10s: %-12s (started %s)","gender",genders[local_2fc].adj,
            genders[u.initgend].adj);
  }
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if (u.ualign.type == u.ualignbase[1]) {
    pcVar11 = align_str(u.ualign.type);
    sprintf(buf2 + 0xf8,"%-10s: %-12s","alignment",pcVar11);
  }
  else {
    pcVar11 = align_str(u.ualign.type);
    pcVar12 = align_str(u.ualignbase[1]);
    sprintf(buf2 + 0xf8,"%-10s: %-12s (started %s)","alignment",pcVar11,pcVar12);
  }
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  sVar4 = acurr(0);
  if (sVar4 < '\x13') {
    sVar4 = acurr(0);
    sprintf(buf2 + 0xf8,"attributes: St:%-1d ",(ulong)(uint)(int)sVar4);
  }
  else {
    sVar4 = acurr(0);
    if (sVar4 < 'w') {
      sVar4 = acurr(0);
      if (sVar4 < 'v') {
        sVar4 = acurr(0);
        sprintf(buf2 + 0xf8,"attributes: St:18/%02d ",(ulong)((int)sVar4 - 0x12));
      }
      else {
        sprintf(buf2 + 0xf8,"attributes: St:18/** ");
      }
    }
    else {
      sVar4 = acurr(0);
      sprintf(buf2 + 0xf8,"attributes: St:%2d ",(ulong)((int)sVar4 - 100));
    }
  }
  pcVar11 = eos(buf2 + 0xf8);
  sVar4 = acurr(3);
  sVar5 = acurr(4);
  sVar6 = acurr(1);
  sVar7 = acurr(2);
  sVar8 = acurr(5);
  iVar9 = (int)sVar8;
  sprintf(pcVar11,"Dx:%-1d Co:%-1d In:%-1d Wi:%-1d Ch:%-1d",(ulong)(uint)(int)sVar4,
          (ulong)(uint)(int)sVar5,(ulong)(uint)(int)sVar6,(ulong)(uint)(int)sVar7,iVar9);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  iVar3 = u.uexp;
  iVar2 = u.ulevel;
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if (u.ulevel < 0x1e) {
    lVar13 = newuexp(u.ulevel);
    sprintf(buf2 + 0xf8,"%-10s: %d (exp: %d, %ld needed)","level",(ulong)(uint)iVar2,
            (ulong)(uint)iVar3,lVar13,iVar9);
  }
  else {
    sprintf(buf2 + 0xf8,"%-10s: %d (exp: %d)","level",(ulong)(uint)u.ulevel,(ulong)(uint)u.uexp);
  }
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if (flags.debug != '\0') {
    sprintf((char *)&menu.size,"(%2d,%2d)",(ulong)(uint)(int)u.ux,(ulong)(uint)(int)u.uy);
    sprintf(buf2 + 0xf8,"%-10s: %-12s","position",&menu.size);
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
    }
    pnVar10 = _item_ + menu.items._4_4_;
    pnVar10->id = 0;
    pnVar10->role = MI_TEXT;
    pnVar10->accel = '\0';
    pnVar10->group_accel = '\0';
    pnVar10->selected = '\0';
    strcpy(pnVar10->caption,buf2 + 0xf8);
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  bVar1 = flags.female;
  if (u.umonnum != u.umonster) {
    bVar1 = (byte)u._1052_1_ >> 3 & 1;
  }
  if ((bVar1 == 0) || (urole.name.f == (char *)0x0)) {
    local_368 = urole.name.m;
  }
  else {
    local_368 = urole.name.f;
  }
  sprintf(buf2 + 0xf8,"%s Deities",local_368);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_HEADING;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  pcVar11 = align_gname(-1);
  if ((u.ualignbase[1] == u.ualign.type) && (u.ualign.type == -1)) {
    local_380 = " (s,c)";
  }
  else {
    if (u.ualignbase[1] == -1) {
      local_388 = " (s)";
    }
    else {
      local_388 = "";
      if (u.ualign.type == -1) {
        local_388 = " (c)";
      }
    }
    local_380 = local_388;
  }
  sprintf((char *)&menu.size,"%-17s%s",pcVar11,local_380);
  sprintf(buf2 + 0xf8,"%-10s: %-12s","Chaotic",&menu.size);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  pcVar11 = align_gname('\0');
  if ((u.ualignbase[1] == u.ualign.type) && (u.ualign.type == '\0')) {
    local_3a0 = " (s,c)";
  }
  else {
    if (u.ualignbase[1] == '\0') {
      local_3a8 = " (s)";
    }
    else {
      local_3a8 = "";
      if (u.ualign.type == '\0') {
        local_3a8 = " (c)";
      }
    }
    local_3a0 = local_3a8;
  }
  sprintf((char *)&menu.size,"%-17s%s",pcVar11,local_3a0);
  sprintf(buf2 + 0xf8,"%-10s: %-12s","Neutral",&menu.size);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  pcVar11 = align_gname('\x01');
  if ((u.ualignbase[1] == u.ualign.type) && (u.ualign.type == '\x01')) {
    local_3c0 = " (s,c)";
  }
  else {
    if (u.ualignbase[1] == '\x01') {
      local_3c8 = " (s)";
    }
    else {
      local_3c8 = "";
      if (u.ualign.type == '\x01') {
        local_3c8 = " (c)";
      }
    }
    local_3c0 = local_3c8;
  }
  sprintf((char *)&menu.size,"%-17s%s",pcVar11,local_3c0);
  sprintf(buf2 + 0xf8,"%-10s: %-12s","Lawful",&menu.size);
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,buf2 + 0xf8);
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_TEXT;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0;
  pnVar10->role = MI_HEADING;
  pnVar10->accel = '\0';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"Other Information");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0x69;
  pnVar10->role = MI_NORMAL;
  pnVar10->accel = 'i';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"Inventory");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0x73;
  pnVar10->role = MI_NORMAL;
  pnVar10->accel = 's';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"Skills");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 0x6e;
  pnVar10->role = MI_NORMAL;
  pnVar10->accel = 'n';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"Intrinsics");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  iVar9 = num_vanquished();
  if (0 < iVar9) {
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
    }
    pnVar10 = _item_ + menu.items._4_4_;
    pnVar10->id = 0x76;
    pnVar10->role = MI_NORMAL;
    pnVar10->accel = 'v';
    pnVar10->group_accel = '\0';
    pnVar10->selected = '\0';
    strcpy(pnVar10->caption,"Vanquished creatures");
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  iVar9 = num_genocides();
  if ((0 < iVar9) || (iVar9 = num_extinctions(), 0 < iVar9)) {
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
    }
    pnVar10 = _item_ + menu.items._4_4_;
    pnVar10->id = 0x67;
    pnVar10->role = MI_NORMAL;
    pnVar10->accel = 'g';
    pnVar10->group_accel = '\0';
    pnVar10->selected = '\0';
    strcpy(pnVar10->caption,"Genocided/extinct creatures");
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  if ((int)menu.items <= menu.items._4_4_) {
    menu.items._0_4_ = (int)menu.items << 1;
    _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
  }
  pnVar10 = _item_ + menu.items._4_4_;
  pnVar10->id = 99;
  pnVar10->role = MI_NORMAL;
  pnVar10->accel = 'c';
  pnVar10->group_accel = '\0';
  pnVar10->selected = '\0';
  strcpy(pnVar10->caption,"Conducts followed");
  menu.items._4_4_ = menu.items._4_4_ + 1;
  if ((flags.debug != '\0') || (flags.explore != '\0')) {
    if ((int)menu.items <= menu.items._4_4_) {
      menu.items._0_4_ = (int)menu.items << 1;
      _item_ = (nh_menuitem *)realloc(_item_,(long)(int)menu.items * 0x10c);
    }
    pnVar10 = _item_ + menu.items._4_4_;
    pnVar10->id = 0x77;
    pnVar10->role = MI_NORMAL;
    pnVar10->accel = 'w';
    pnVar10->group_accel = '\0';
    pnVar10->selected = '\0';
    strcpy(pnVar10->caption,"Debug/explore mode spoilers");
    menu.items._4_4_ = menu.items._4_4_ + 1;
  }
  iVar9 = display_menu(_item_,menu.items._4_4_,"Your Attributes:",1,(int *)(buf + 0xfc));
  if (iVar9 == 1) {
    switch(buf._252_4_) {
    case 99:
      doconduct();
      break;
    case 0x67:
      list_genocided('y','\0');
      break;
    case 0x69:
      ddoinv();
      break;
    case 0x6e:
      unspoilered_intrinsics();
      break;
    case 0x73:
      enhance_weapon_skill();
      break;
    case 0x76:
      list_vanquished('y','\0');
      break;
    case 0x77:
      if ((flags.debug != '\0') || (flags.explore != '\0')) {
        enlightenment(0);
      }
    }
  }
  free(_item_);
  return iVar9 != -1;
}

Assistant:

static boolean minimal_enlightenment(void)
{
	int genidx, n, selected[1];
	char buf[BUFSZ], buf2[BUFSZ];
	static const char fmtstr[] = "%-10s: %-12s (started %s)";
	static const char fmtstr_noorig[] = "%-10s: %-12s";
	static const char deity_fmtstr[] = "%-17s%s";
	struct menulist menu;

	init_menulist(&menu);

	buf[0] = buf2[0] = '\0';
	add_menuheading(&menu, "Character Information");

	/* Starting and current name, race, role, gender, alignment */
	sprintf(buf, fmtstr_noorig, "name", plname);
	add_menutext(&menu, buf);

	if (Upolyd) {
	    sprintf(buf, fmtstr, "race", mons_mname(youmonst.data), urace.noun);
	} else {
	    sprintf(buf, fmtstr_noorig, "race", urace.noun);
	}
	add_menutext(&menu, buf);

	sprintf(buf, fmtstr_noorig, "role",
		((Upolyd ? u.mfemale : flags.female) && urole.name.f) ?
		urole.name.f : urole.name.m);
	add_menutext(&menu, buf);

	/* don't want poly_gender() here; it forces `2' for non-humanoids */
	genidx = is_neuter(youmonst.data) ? 2 : flags.female;
	if (genidx != u.initgend) {
	    sprintf(buf, fmtstr, "gender", genders[genidx].adj,
		    genders[u.initgend].adj);
	} else {
	    sprintf(buf, fmtstr_noorig, "gender", genders[genidx].adj);
	}
	add_menutext(&menu, buf);

	if (u.ualign.type != u.ualignbase[A_ORIGINAL]) {
	    sprintf(buf, fmtstr, "alignment", align_str(u.ualign.type),
		    align_str(u.ualignbase[A_ORIGINAL]));
	} else {
	    sprintf(buf, fmtstr_noorig, "alignment", align_str(u.ualign.type));
	}
	add_menutext(&menu, buf);

	if (ACURR(A_STR) > 18) {
	    if (ACURR(A_STR) > STR18(100))
		sprintf(buf, "attributes: St:%2d ", ACURR(A_STR) - 100);
	    else if (ACURR(A_STR) < STR18(100))
		sprintf(buf, "attributes: St:18/%02d ", ACURR(A_STR) - 18);
	    else
		sprintf(buf, "attributes: St:18/** ");
	} else {
	    sprintf(buf, "attributes: St:%-1d ", ACURR(A_STR));
	}
	sprintf(eos(buf), "Dx:%-1d Co:%-1d In:%-1d Wi:%-1d Ch:%-1d",
		ACURR(A_DEX), ACURR(A_CON), ACURR(A_INT), ACURR(A_WIS), ACURR(A_CHA));
	add_menutext(&menu, buf);

	if (u.ulevel < 30) {
	    sprintf(buf, "%-10s: %d (exp: %d, %ld needed)", "level",
		    u.ulevel, u.uexp, newuexp(u.ulevel));
	} else {
	    sprintf(buf, "%-10s: %d (exp: %d)", "level",
		    u.ulevel, u.uexp);
	}
	add_menutext(&menu, buf);

	/* Current position of hero */
	if (wizard) {
	    sprintf(buf2, "(%2d,%2d)", u.ux, u.uy);
	    sprintf(buf, fmtstr_noorig, "position", buf2);
	    add_menutext(&menu, buf);
	}

	/* Deity list */
	add_menutext(&menu, "");
	sprintf(buf, "%s Deities",
		((Upolyd ? u.mfemale : flags.female) && urole.name.f) ?
		urole.name.f : urole.name.m);
	add_menuheading(&menu, buf);

	sprintf(buf2, deity_fmtstr, align_gname(A_CHAOTIC),
	    (u.ualignbase[A_ORIGINAL] == u.ualign.type
		&& u.ualign.type == A_CHAOTIC) ? " (s,c)" :
	    (u.ualignbase[A_ORIGINAL] == A_CHAOTIC)       ? " (s)" :
	    (u.ualign.type   == A_CHAOTIC)       ? " (c)" : "");
	sprintf(buf, fmtstr_noorig, "Chaotic", buf2);
	add_menutext(&menu, buf);

	sprintf(buf2, deity_fmtstr, align_gname(A_NEUTRAL),
	    (u.ualignbase[A_ORIGINAL] == u.ualign.type
		&& u.ualign.type == A_NEUTRAL) ? " (s,c)" :
	    (u.ualignbase[A_ORIGINAL] == A_NEUTRAL)       ? " (s)" :
	    (u.ualign.type   == A_NEUTRAL)       ? " (c)" : "");
	sprintf(buf, fmtstr_noorig, "Neutral", buf2);
	add_menutext(&menu, buf);

	sprintf(buf2, deity_fmtstr, align_gname(A_LAWFUL),
	    (u.ualignbase[A_ORIGINAL] == u.ualign.type &&
		u.ualign.type == A_LAWFUL)  ? " (s,c)" :
	    (u.ualignbase[A_ORIGINAL] == A_LAWFUL)        ? " (s)" :
	    (u.ualign.type   == A_LAWFUL)        ? " (c)" : "");
	sprintf(buf, fmtstr_noorig, "Lawful", buf2);
	add_menutext(&menu, buf);

	add_menutext(&menu, "");
	add_menuheading(&menu, "Other Information");
	add_menuitem(&menu, 'i', "Inventory", 'i', FALSE);
	add_menuitem(&menu, 's', "Skills", 's', FALSE);
	add_menuitem(&menu, 'n', "Intrinsics", 'n', FALSE);
	if (num_vanquished() > 0)
	    add_menuitem(&menu, 'v', "Vanquished creatures", 'v', FALSE);
	if (num_genocides() > 0 || num_extinctions() > 0)
	    add_menuitem(&menu, 'g', "Genocided/extinct creatures", 'g', FALSE);
	add_menuitem(&menu, 'c', "Conducts followed", 'c', FALSE);
	if (wizard || discover)
	    add_menuitem(&menu, 'w', "Debug/explore mode spoilers", 'w', FALSE);

	n = display_menu(menu.items, menu.icount, "Your Attributes:",
			 PICK_ONE, selected);

	if (n == 1) {
	    switch (selected[0]) {
	    case 'i': ddoinv(); break;
	    case 's': enhance_weapon_skill(); break;
	    case 'n': unspoilered_intrinsics(); break;
	    case 'v': list_vanquished('y', FALSE); break;
	    case 'g': list_genocided('y', FALSE); break;
	    case 'c': doconduct(); break;
	    case 'w': if (wizard || discover) enlightenment(0); break;
	    }
	}

	free(menu.items);
	return n != -1;
}